

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usd-export.cc
# Opt level: O2

bool tinyusdz::tydra::detail::ToMaterialPrim
               (RenderScene *scene,string *abs_path,size_t material_id,Prim *dst,string *err)

{
  pointer pRVar1;
  pointer pUVar2;
  pointer pSVar3;
  pointer pRVar4;
  bool bVar5;
  bool bVar6;
  ostream *poVar7;
  ulong uVar8;
  char *pcVar9;
  Shader *node;
  pointer prim;
  allocator local_4c01;
  string *err_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4bf8;
  anon_class_16_2_2591ee82 ConstructUVTexture;
  string abs_mat_path;
  vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> shader_nodes;
  string local_4b88;
  pointer local_4b68;
  Prim *local_4b60;
  Prim matPrim;
  string abs_shader_path;
  Prim shaderNodePrim;
  Shader shader;
  Prim shaderPrim;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> local_3600;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> local_3368;
  optional<tinyusdz::Animatable<int>> local_2eb0 [104];
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> local_2e48;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> local_2bb0;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> local_2928;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> local_26a0;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> local_2418;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> local_2190;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> local_1f08;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> local_1c80;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::normal3f>_> local_19f8;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> local_1760;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> local_14d8;
  bool local_1048;
  Material mat;
  
  ConstructUVTexture.err = &err_local;
  pRVar1 = (scene->materials).
           super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
           ._M_impl.super__Vector_impl_data._M_start;
  err_local = err;
  ConstructUVTexture.scene = scene;
  local_4b60 = dst;
  Material::Material(&mat);
  local_4b68 = pRVar1 + material_id;
  ::std::__cxx11::string::_M_assign((string *)&mat);
  Shader::Shader(&shader);
  ::std::__cxx11::string::assign((char *)&shader);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaderPrim,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)abs_path,"/"
                  );
  ::std::operator+(&abs_mat_path,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaderPrim,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat);
  ::std::__cxx11::string::_M_dispose();
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaderPrim,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &abs_mat_path,"/");
  ::std::operator+(&abs_shader_path,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaderPrim,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shader);
  ::std::__cxx11::string::_M_dispose();
  shader_nodes.super__Vector_base<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shader_nodes.super__Vector_base<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  shader_nodes.super__Vector_base<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UsdPreviewSurface::UsdPreviewSurface((UsdPreviewSurface *)&shaderPrim);
  ::std::__cxx11::string::assign((char *)&shader.info_id);
  local_1048 = true;
  matPrim._abs_path._prim_part.field_2._M_local_buf[8] = '\0';
  matPrim._abs_path._prim_part.field_2._9_7_ = 0;
  matPrim._abs_path._prop_part._M_dataplus._M_p._0_1_ = 0;
  matPrim._abs_path._prim_part._M_string_length = 0;
  matPrim._abs_path._prim_part.field_2._M_local_buf[0] = '\0';
  matPrim._abs_path._prim_part.field_2._M_allocated_capacity._1_7_ = 0;
  matPrim._abs_path._prim_part._M_dataplus._M_p._4_2_ = 1;
  matPrim._abs_path._prim_part._M_dataplus._M_p._0_4_ =
       (float)(uint)pRVar1[material_id].surfaceShader.useSpecularWorkflow;
  nonstd::optional_lite::optional<tinyusdz::Animatable<int>>::operator=
            (local_2eb0,(Animatable<int> *)&matPrim);
  ::std::
  _Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
  ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                   *)&matPrim._abs_path._prim_part._M_string_length);
  pRVar4 = local_4b68;
  uVar8 = (ulong)pRVar1[material_id].surfaceShader.diffuseColor.texture_id;
  if ((long)uVar8 < 0) {
    matPrim._abs_path._prim_part._M_dataplus._M_p =
         *(pointer *)(local_4b68->surfaceShader).diffuseColor.value._M_elems;
    matPrim._abs_path._prop_part._M_dataplus._M_p._0_1_ = 0;
    matPrim._abs_path._prop_part._1_8_ = 0;
    matPrim._abs_path._prim_part.field_2._M_local_buf[0] = '\0';
    matPrim._abs_path._prim_part.field_2._M_allocated_capacity._1_7_ = 0;
    matPrim._abs_path._prim_part.field_2._M_local_buf[8] = '\0';
    matPrim._abs_path._prim_part.field_2._9_7_ = 0;
    uVar8 = matPrim._abs_path._prim_part._M_string_length >> 0x28;
    matPrim._abs_path._prim_part._M_string_length._0_5_ =
         CONCAT14(1,*(float *)((long)&(local_4b68->surfaceShader).diffuseColor.value + 8));
    matPrim._abs_path._prim_part._M_string_length =
         CONCAT35((int3)uVar8,(undefined5)matPrim._abs_path._prim_part._M_string_length) &
         0xffff00ffffffffff;
    nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::color3f>>::operator=
              ((optional<tinyusdz::Animatable<tinyusdz::value::color3f>> *)&local_3600._attrib,
               (Animatable<tinyusdz::value::color3f> *)&matPrim);
    ::std::
    _Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample>_>
    ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample>_>
                     *)&matPrim._abs_path._prim_part.field_2);
LAB_00279c8b:
    uVar8 = (ulong)(pRVar4->surfaceShader).specularColor.texture_id;
    if ((long)uVar8 < 0) {
      matPrim._abs_path._prim_part._M_dataplus._M_p =
           *(pointer *)(pRVar4->surfaceShader).specularColor.value._M_elems;
      matPrim._abs_path._prop_part._M_dataplus._M_p._0_1_ = 0;
      matPrim._abs_path._prop_part._1_8_ = 0;
      matPrim._abs_path._prim_part.field_2._M_local_buf[0] = '\0';
      matPrim._abs_path._prim_part.field_2._M_allocated_capacity._1_7_ = 0;
      matPrim._abs_path._prim_part.field_2._M_local_buf[8] = '\0';
      matPrim._abs_path._prim_part.field_2._9_7_ = 0;
      uVar8 = matPrim._abs_path._prim_part._M_string_length >> 0x28;
      matPrim._abs_path._prim_part._M_string_length._0_5_ =
           CONCAT14(1,*(float *)((long)&(pRVar4->surfaceShader).specularColor.value + 8));
      matPrim._abs_path._prim_part._M_string_length =
           CONCAT35((int3)uVar8,(undefined5)matPrim._abs_path._prim_part._M_string_length) &
           0xffff00ffffffffff;
      nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::color3f>>::operator=
                ((optional<tinyusdz::Animatable<tinyusdz::value::color3f>> *)&local_2e48._attrib,
                 (Animatable<tinyusdz::value::color3f> *)&matPrim);
      ::std::
      _Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample>_>
      ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample>_>
                       *)&matPrim._abs_path._prim_part.field_2);
LAB_00279e8d:
      uVar8 = (ulong)(pRVar4->surfaceShader).emissiveColor.texture_id;
      if ((long)uVar8 < 0) {
        matPrim._abs_path._prim_part._M_dataplus._M_p =
             *(pointer *)(pRVar4->surfaceShader).emissiveColor.value._M_elems;
        matPrim._abs_path._prop_part._M_dataplus._M_p._0_1_ = 0;
        matPrim._abs_path._prop_part._1_8_ = 0;
        matPrim._abs_path._prim_part.field_2._M_local_buf[0] = '\0';
        matPrim._abs_path._prim_part.field_2._M_allocated_capacity._1_7_ = 0;
        matPrim._abs_path._prim_part.field_2._M_local_buf[8] = '\0';
        matPrim._abs_path._prim_part.field_2._9_7_ = 0;
        uVar8 = matPrim._abs_path._prim_part._M_string_length >> 0x28;
        matPrim._abs_path._prim_part._M_string_length._0_5_ =
             CONCAT14(1,*(float *)((long)&(pRVar4->surfaceShader).emissiveColor.value + 8));
        matPrim._abs_path._prim_part._M_string_length =
             CONCAT35((int3)uVar8,(undefined5)matPrim._abs_path._prim_part._M_string_length) &
             0xffff00ffffffffff;
        nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::color3f>>::operator=
                  ((optional<tinyusdz::Animatable<tinyusdz::value::color3f>> *)&local_3368._attrib,
                   (Animatable<tinyusdz::value::color3f> *)&matPrim);
        ::std::
        _Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample>_>
        ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample>_>
                         *)&matPrim._abs_path._prim_part.field_2);
LAB_0027a10c:
        uVar8 = (ulong)(pRVar4->surfaceShader).metallic.texture_id;
        if ((long)uVar8 < 0) {
          matPrim._abs_path._prim_part.field_2._M_local_buf[8] = '\0';
          matPrim._abs_path._prim_part.field_2._9_7_ = 0;
          matPrim._abs_path._prop_part._M_dataplus._M_p._0_1_ = 0;
          matPrim._abs_path._prim_part._M_string_length = 0;
          matPrim._abs_path._prim_part.field_2._M_local_buf[0] = '\0';
          matPrim._abs_path._prim_part.field_2._M_allocated_capacity._1_7_ = 0;
          matPrim._abs_path._prim_part._M_dataplus._M_p._4_2_ = 1;
          matPrim._abs_path._prim_part._M_dataplus._M_p._0_4_ =
               (pRVar4->surfaceShader).metallic.value;
          nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::operator=
                    ((optional<tinyusdz::Animatable<float>> *)&local_2bb0._attrib,
                     (Animatable<float> *)&matPrim);
          ::std::
          _Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
          ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                           *)&matPrim._abs_path._prim_part._M_string_length);
LAB_0027a381:
          uVar8 = (ulong)(pRVar4->surfaceShader).roughness.texture_id;
          if ((long)uVar8 < 0) {
            matPrim._abs_path._prim_part.field_2._M_local_buf[8] = '\0';
            matPrim._abs_path._prim_part.field_2._9_7_ = 0;
            matPrim._abs_path._prop_part._M_dataplus._M_p._0_1_ = 0;
            matPrim._abs_path._prim_part._M_string_length = 0;
            matPrim._abs_path._prim_part.field_2._M_local_buf[0] = '\0';
            matPrim._abs_path._prim_part.field_2._M_allocated_capacity._1_7_ = 0;
            matPrim._abs_path._prim_part._M_dataplus._M_p._4_2_ = 1;
            matPrim._abs_path._prim_part._M_dataplus._M_p._0_4_ =
                 (pRVar4->surfaceShader).roughness.value;
            nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::operator=
                      ((optional<tinyusdz::Animatable<float>> *)&local_2418._attrib,
                       (Animatable<float> *)&matPrim);
            ::std::
            _Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
            ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                             *)&matPrim._abs_path._prim_part._M_string_length);
LAB_0027a5f6:
            uVar8 = (ulong)(pRVar4->surfaceShader).clearcoat.texture_id;
            if ((long)uVar8 < 0) {
              matPrim._abs_path._prim_part.field_2._M_local_buf[8] = '\0';
              matPrim._abs_path._prim_part.field_2._9_7_ = 0;
              matPrim._abs_path._prop_part._M_dataplus._M_p._0_1_ = 0;
              matPrim._abs_path._prim_part._M_string_length = 0;
              matPrim._abs_path._prim_part.field_2._M_local_buf[0] = '\0';
              matPrim._abs_path._prim_part.field_2._M_allocated_capacity._1_7_ = 0;
              matPrim._abs_path._prim_part._M_dataplus._M_p._4_2_ = 1;
              matPrim._abs_path._prim_part._M_dataplus._M_p._0_4_ =
                   (pRVar4->surfaceShader).clearcoat.value;
              nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::operator=
                        ((optional<tinyusdz::Animatable<float>> *)&local_2928._attrib,
                         (Animatable<float> *)&matPrim);
              ::std::
              _Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
              ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                               *)&matPrim._abs_path._prim_part._M_string_length);
LAB_0027a86b:
              uVar8 = (ulong)(pRVar4->surfaceShader).clearcoatRoughness.texture_id;
              if ((long)uVar8 < 0) {
                matPrim._abs_path._prim_part.field_2._M_local_buf[8] = '\0';
                matPrim._abs_path._prim_part.field_2._9_7_ = 0;
                matPrim._abs_path._prop_part._M_dataplus._M_p._0_1_ = 0;
                matPrim._abs_path._prim_part._M_string_length = 0;
                matPrim._abs_path._prim_part.field_2._M_local_buf[0] = '\0';
                matPrim._abs_path._prim_part.field_2._M_allocated_capacity._1_7_ = 0;
                matPrim._abs_path._prim_part._M_dataplus._M_p._4_2_ = 1;
                matPrim._abs_path._prim_part._M_dataplus._M_p._0_4_ =
                     (pRVar4->surfaceShader).clearcoatRoughness.value;
                nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::operator=
                          ((optional<tinyusdz::Animatable<float>> *)&local_26a0._attrib,
                           (Animatable<float> *)&matPrim);
                ::std::
                _Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                                 *)&matPrim._abs_path._prim_part._M_string_length);
LAB_0027aae0:
                uVar8 = (ulong)(pRVar4->surfaceShader).opacity.texture_id;
                if ((long)uVar8 < 0) {
                  matPrim._abs_path._prim_part.field_2._M_local_buf[8] = '\0';
                  matPrim._abs_path._prim_part.field_2._9_7_ = 0;
                  matPrim._abs_path._prop_part._M_dataplus._M_p._0_1_ = 0;
                  matPrim._abs_path._prim_part._M_string_length = 0;
                  matPrim._abs_path._prim_part.field_2._M_local_buf[0] = '\0';
                  matPrim._abs_path._prim_part.field_2._M_allocated_capacity._1_7_ = 0;
                  matPrim._abs_path._prim_part._M_dataplus._M_p._4_2_ = 1;
                  matPrim._abs_path._prim_part._M_dataplus._M_p._0_4_ =
                       (pRVar4->surfaceShader).opacity.value;
                  nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::operator=
                            ((optional<tinyusdz::Animatable<float>> *)&local_2190._attrib,
                             (Animatable<float> *)&matPrim);
                  ::std::
                  _Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                  ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                                   *)&matPrim._abs_path._prim_part._M_string_length);
LAB_0027ad55:
                  uVar8 = (ulong)(pRVar4->surfaceShader).opacityThreshold.texture_id;
                  if ((long)uVar8 < 0) {
                    matPrim._abs_path._prim_part.field_2._M_local_buf[8] = '\0';
                    matPrim._abs_path._prim_part.field_2._9_7_ = 0;
                    matPrim._abs_path._prop_part._M_dataplus._M_p._0_1_ = 0;
                    matPrim._abs_path._prim_part._M_string_length = 0;
                    matPrim._abs_path._prim_part.field_2._M_local_buf[0] = '\0';
                    matPrim._abs_path._prim_part.field_2._M_allocated_capacity._1_7_ = 0;
                    matPrim._abs_path._prim_part._M_dataplus._M_p._4_2_ = 1;
                    matPrim._abs_path._prim_part._M_dataplus._M_p._0_4_ =
                         (pRVar4->surfaceShader).opacityThreshold.value;
                    nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::operator=
                              ((optional<tinyusdz::Animatable<float>> *)&local_1f08._attrib,
                               (Animatable<float> *)&matPrim);
                    ::std::
                    _Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                    ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                                     *)&matPrim._abs_path._prim_part._M_string_length);
LAB_0027afca:
                    uVar8 = (ulong)(pRVar4->surfaceShader).ior.texture_id;
                    if ((long)uVar8 < 0) {
                      matPrim._abs_path._prim_part.field_2._M_local_buf[8] = '\0';
                      matPrim._abs_path._prim_part.field_2._9_7_ = 0;
                      matPrim._abs_path._prop_part._M_dataplus._M_p._0_1_ = 0;
                      matPrim._abs_path._prim_part._M_string_length = 0;
                      matPrim._abs_path._prim_part.field_2._M_local_buf[0] = '\0';
                      matPrim._abs_path._prim_part.field_2._M_allocated_capacity._1_7_ = 0;
                      matPrim._abs_path._prim_part._M_dataplus._M_p._4_2_ = 1;
                      matPrim._abs_path._prim_part._M_dataplus._M_p._0_4_ =
                           (pRVar4->surfaceShader).ior.value;
                      nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::operator=
                                ((optional<tinyusdz::Animatable<float>> *)&local_1c80._attrib,
                                 (Animatable<float> *)&matPrim);
                      ::std::
                      _Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                      ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                                       *)&matPrim._abs_path._prim_part._M_string_length);
LAB_0027b23f:
                      uVar8 = (ulong)(pRVar4->surfaceShader).occlusion.texture_id;
                      if ((long)uVar8 < 0) {
                        matPrim._abs_path._prim_part.field_2._M_local_buf[8] = '\0';
                        matPrim._abs_path._prim_part.field_2._9_7_ = 0;
                        matPrim._abs_path._prop_part._M_dataplus._M_p._0_1_ = 0;
                        matPrim._abs_path._prim_part._M_string_length = 0;
                        matPrim._abs_path._prim_part.field_2._M_local_buf[0] = '\0';
                        matPrim._abs_path._prim_part.field_2._M_allocated_capacity._1_7_ = 0;
                        matPrim._abs_path._prim_part._M_dataplus._M_p._4_2_ = 1;
                        matPrim._abs_path._prim_part._M_dataplus._M_p._0_4_ =
                             (pRVar4->surfaceShader).occlusion.value;
                        nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::operator=
                                  ((optional<tinyusdz::Animatable<float>> *)&local_14d8._attrib,
                                   (Animatable<float> *)&matPrim);
                        ::std::
                        _Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                        ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                                         *)&matPrim._abs_path._prim_part._M_string_length);
LAB_0027b4b4:
                        uVar8 = (ulong)(pRVar4->surfaceShader).normal.texture_id;
                        if ((long)uVar8 < 0) {
                          matPrim._abs_path._prim_part._M_dataplus._M_p =
                               *(pointer *)(pRVar4->surfaceShader).normal.value._M_elems;
                          matPrim._abs_path._prop_part._M_dataplus._M_p._0_1_ = 0;
                          matPrim._abs_path._prop_part._1_8_ = 0;
                          matPrim._abs_path._prim_part.field_2._M_local_buf[0] = '\0';
                          matPrim._abs_path._prim_part.field_2._M_allocated_capacity._1_7_ = 0;
                          matPrim._abs_path._prim_part.field_2._M_local_buf[8] = '\0';
                          matPrim._abs_path._prim_part.field_2._9_7_ = 0;
                          uVar8 = matPrim._abs_path._prim_part._M_string_length >> 0x28;
                          matPrim._abs_path._prim_part._M_string_length._0_5_ =
                               CONCAT14(1,*(float *)((long)&(pRVar4->surfaceShader).normal.value + 8
                                                    ));
                          matPrim._abs_path._prim_part._M_string_length =
                               CONCAT35((int3)uVar8,
                                        (undefined5)matPrim._abs_path._prim_part._M_string_length) &
                               0xffff00ffffffffff;
                          nonstd::optional_lite::
                          optional<tinyusdz::Animatable<tinyusdz::value::normal3f>>::operator=
                                    ((optional<tinyusdz::Animatable<tinyusdz::value::normal3f>> *)
                                     &local_19f8._attrib,
                                     (Animatable<tinyusdz::value::normal3f> *)&matPrim);
                          ::std::
                          _Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                          ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                           *)&matPrim._abs_path._prim_part.field_2);
LAB_0027b739:
                          uVar8 = (ulong)(pRVar4->surfaceShader).displacement.texture_id;
                          if ((long)uVar8 < 0) {
                            matPrim._abs_path._prim_part.field_2._M_local_buf[8] = '\0';
                            matPrim._abs_path._prim_part.field_2._9_7_ = 0;
                            matPrim._abs_path._prop_part._M_dataplus._M_p._0_1_ = 0;
                            matPrim._abs_path._prim_part._M_string_length = 0;
                            matPrim._abs_path._prim_part.field_2._M_local_buf[0] = '\0';
                            matPrim._abs_path._prim_part.field_2._M_allocated_capacity._1_7_ = 0;
                            matPrim._abs_path._prim_part._M_dataplus._M_p._4_2_ = 1;
                            matPrim._abs_path._prim_part._M_dataplus._M_p._0_4_ =
                                 (pRVar4->surfaceShader).displacement.value;
                            nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::operator=
                                      ((optional<tinyusdz::Animatable<float>> *)&local_1760._attrib,
                                       (Animatable<float> *)&matPrim);
                            ::std::
                            _Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                            ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                                             *)&matPrim._abs_path._prim_part._M_string_length);
LAB_0027b9ae:
                            ::std::__cxx11::string::string
                                      ((string *)&shaderNodePrim,"outputs:surface",
                                       (allocator *)&local_4bf8);
                            Path::Path(&matPrim._abs_path,&abs_shader_path,(string *)&shaderNodePrim
                                      );
                            TypedConnection<tinyusdz::Token>::set(&mat.surface,&matPrim._abs_path);
                            Path::~Path(&matPrim._abs_path);
                            ::std::__cxx11::string::_M_dispose();
                            linb::any::operator=(&shader.value.v_,(UsdPreviewSurface *)&shaderPrim);
                            UsdPreviewSurface::~UsdPreviewSurface((UsdPreviewSurface *)&shaderPrim);
                            Prim::Prim<tinyusdz::Shader>(&shaderPrim,&shader);
                            Prim::Prim<tinyusdz::Material>(&matPrim,&mat);
                            Prim::add_child(&matPrim,&shaderPrim,true,(string *)0x0);
                            pSVar3 = shader_nodes.
                                     super__Vector_base<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                            prim = shader_nodes.
                                   super__Vector_base<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                            do {
                              bVar5 = prim == pSVar3;
                              if (bVar5) {
                                Prim::operator=(local_4b60,&matPrim);
                                break;
                              }
                              Prim::Prim<tinyusdz::Shader>(&shaderNodePrim,prim);
                              bVar6 = Prim::add_child(&matPrim,&shaderNodePrim,false,err_local);
                              Prim::~Prim(&shaderNodePrim);
                              prim = prim + 1;
                            } while (bVar6);
                            Prim::~Prim(&matPrim);
                            Prim::~Prim(&shaderPrim);
                            goto LAB_0027bc72;
                          }
                          pUVar2 = (scene->textures).
                                   super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          if ((ulong)(((long)(scene->textures).
                                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pUVar2) / 0x158) < uVar8) {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
                            poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
                            poVar7 = ::std::operator<<(poVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                                  );
                            poVar7 = ::std::operator<<(poVar7,":");
                            poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
                            poVar7 = ::std::operator<<(poVar7,"():");
                            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x4a8);
                            ::std::operator<<(poVar7," ");
                            pcVar9 = "Invalid texture_id for \'displacement\' texture.";
                          }
                          else {
                            ::std::__cxx11::string::string
                                      ((string *)&matPrim,"displacement",
                                       (allocator *)&shaderNodePrim);
                            bVar5 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                                              (&ConstructUVTexture,pUVar2 + uVar8,(string *)&matPrim
                                               ,&abs_mat_path,&shader_nodes);
                            ::std::__cxx11::string::_M_dispose();
                            if (bVar5) {
                              ::std::operator+(&local_4bf8,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&abs_mat_path,"/Image_Texture_");
                              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&shaderNodePrim,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&local_4bf8,"displacement");
                              ::std::__cxx11::string::string
                                        ((string *)&local_4b88,"outputs:rgb",&local_4c01);
                              Path::Path(&matPrim._abs_path,(string *)&shaderNodePrim,&local_4b88);
                              ::std::__cxx11::string::_M_dispose();
                              ::std::__cxx11::string::_M_dispose();
                              ::std::__cxx11::string::_M_dispose();
                              TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::
                              set_connection(&local_1760,&matPrim._abs_path);
                              local_1760._empty = true;
                              Path::~Path(&matPrim._abs_path);
                              goto LAB_0027b9ae;
                            }
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
                            poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
                            poVar7 = ::std::operator<<(poVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                                  );
                            poVar7 = ::std::operator<<(poVar7,":");
                            poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
                            poVar7 = ::std::operator<<(poVar7,"():");
                            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x4ac);
                            ::std::operator<<(poVar7," ");
                            pcVar9 = "Failed to convert \'displacement\' texture.";
                          }
                        }
                        else {
                          pUVar2 = (scene->textures).
                                   super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          if ((ulong)(((long)(scene->textures).
                                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pUVar2) / 0x158) < uVar8) {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
                            poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
                            poVar7 = ::std::operator<<(poVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                                  );
                            poVar7 = ::std::operator<<(poVar7,":");
                            poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
                            poVar7 = ::std::operator<<(poVar7,"():");
                            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x493);
                            ::std::operator<<(poVar7," ");
                            pcVar9 = "Invalid texture_id for \'normal\' texture.";
                          }
                          else {
                            ::std::__cxx11::string::string
                                      ((string *)&matPrim,"normal",(allocator *)&shaderNodePrim);
                            bVar5 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                                              (&ConstructUVTexture,pUVar2 + uVar8,(string *)&matPrim
                                               ,&abs_mat_path,&shader_nodes);
                            ::std::__cxx11::string::_M_dispose();
                            if (bVar5) {
                              ::std::operator+(&local_4bf8,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&abs_mat_path,"/Image_Texture_");
                              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&shaderNodePrim,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&local_4bf8,"normal");
                              ::std::__cxx11::string::string
                                        ((string *)&local_4b88,"outputs:rgb",&local_4c01);
                              Path::Path(&matPrim._abs_path,(string *)&shaderNodePrim,&local_4b88);
                              ::std::__cxx11::string::_M_dispose();
                              ::std::__cxx11::string::_M_dispose();
                              ::std::__cxx11::string::_M_dispose();
                              TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::normal3f>_>
                              ::set_connection(&local_19f8,&matPrim._abs_path);
                              local_19f8._empty = true;
                              Path::~Path(&matPrim._abs_path);
                              goto LAB_0027b739;
                            }
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
                            poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
                            poVar7 = ::std::operator<<(poVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                                  );
                            poVar7 = ::std::operator<<(poVar7,":");
                            poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
                            poVar7 = ::std::operator<<(poVar7,"():");
                            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x497);
                            ::std::operator<<(poVar7," ");
                            pcVar9 = "Failed to convert \'normal\' texture.";
                          }
                        }
                      }
                      else {
                        pUVar2 = (scene->textures).
                                 super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        if ((ulong)(((long)(scene->textures).
                                           super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2
                                    ) / 0x158) < uVar8) {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
                          poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
                          poVar7 = ::std::operator<<(poVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                                  );
                          poVar7 = ::std::operator<<(poVar7,":");
                          poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
                          poVar7 = ::std::operator<<(poVar7,"():");
                          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x482);
                          ::std::operator<<(poVar7," ");
                          pcVar9 = "Invalid texture_id for \'occlusion\' texture.";
                        }
                        else {
                          ::std::__cxx11::string::string
                                    ((string *)&matPrim,"occlusion",(allocator *)&shaderNodePrim);
                          bVar5 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                                            (&ConstructUVTexture,pUVar2 + uVar8,(string *)&matPrim,
                                             &abs_mat_path,&shader_nodes);
                          ::std::__cxx11::string::_M_dispose();
                          if (bVar5) {
                            ::std::operator+(&local_4bf8,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&abs_mat_path,"/Image_Texture_");
                            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&shaderNodePrim,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&local_4bf8,"occlusion");
                            ::std::__cxx11::string::string
                                      ((string *)&local_4b88,"outputs:r",&local_4c01);
                            Path::Path(&matPrim._abs_path,(string *)&shaderNodePrim,&local_4b88);
                            ::std::__cxx11::string::_M_dispose();
                            ::std::__cxx11::string::_M_dispose();
                            ::std::__cxx11::string::_M_dispose();
                            TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
                                      (&local_14d8,&matPrim._abs_path);
                            local_14d8._empty = true;
                            Path::~Path(&matPrim._abs_path);
                            goto LAB_0027b4b4;
                          }
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
                          poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
                          poVar7 = ::std::operator<<(poVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                                  );
                          poVar7 = ::std::operator<<(poVar7,":");
                          poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
                          poVar7 = ::std::operator<<(poVar7,"():");
                          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x486);
                          ::std::operator<<(poVar7," ");
                          pcVar9 = "Failed to convert \'occlusion\' texture.";
                        }
                      }
                    }
                    else {
                      pUVar2 = (scene->textures).
                               super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      if ((ulong)(((long)(scene->textures).
                                         super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2)
                                 / 0x158) < uVar8) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
                        poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
                        poVar7 = ::std::operator<<(poVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                                  );
                        poVar7 = ::std::operator<<(poVar7,":");
                        poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
                        poVar7 = ::std::operator<<(poVar7,"():");
                        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x471);
                        ::std::operator<<(poVar7," ");
                        pcVar9 = "Invalid texture_id for \'ior\' texture.";
                      }
                      else {
                        ::std::__cxx11::string::string
                                  ((string *)&matPrim,"ior",(allocator *)&shaderNodePrim);
                        bVar5 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                                          (&ConstructUVTexture,pUVar2 + uVar8,(string *)&matPrim,
                                           &abs_mat_path,&shader_nodes);
                        ::std::__cxx11::string::_M_dispose();
                        if (bVar5) {
                          ::std::operator+(&local_4bf8,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&abs_mat_path,"/Image_Texture_");
                          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&shaderNodePrim,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&local_4bf8,"ior");
                          ::std::__cxx11::string::string
                                    ((string *)&local_4b88,"outputs:r",&local_4c01);
                          Path::Path(&matPrim._abs_path,(string *)&shaderNodePrim,&local_4b88);
                          ::std::__cxx11::string::_M_dispose();
                          ::std::__cxx11::string::_M_dispose();
                          ::std::__cxx11::string::_M_dispose();
                          TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
                                    (&local_1c80,&matPrim._abs_path);
                          local_1c80._empty = true;
                          Path::~Path(&matPrim._abs_path);
                          goto LAB_0027b23f;
                        }
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
                        poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
                        poVar7 = ::std::operator<<(poVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                                  );
                        poVar7 = ::std::operator<<(poVar7,":");
                        poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
                        poVar7 = ::std::operator<<(poVar7,"():");
                        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x475);
                        ::std::operator<<(poVar7," ");
                        pcVar9 = "Failed to convert \'ior\' texture.";
                      }
                    }
                  }
                  else {
                    pUVar2 = (scene->textures).
                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    if ((ulong)(((long)(scene->textures).
                                       super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) /
                               0x158) < uVar8) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
                      poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
                      poVar7 = ::std::operator<<(poVar7,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                                );
                      poVar7 = ::std::operator<<(poVar7,":");
                      poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
                      poVar7 = ::std::operator<<(poVar7,"():");
                      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x460);
                      ::std::operator<<(poVar7," ");
                      pcVar9 = "Invalid texture_id for \'opacityThreshold\' texture.";
                    }
                    else {
                      ::std::__cxx11::string::string
                                ((string *)&matPrim,"opacityThreshold",(allocator *)&shaderNodePrim)
                      ;
                      bVar5 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                                        (&ConstructUVTexture,pUVar2 + uVar8,(string *)&matPrim,
                                         &abs_mat_path,&shader_nodes);
                      ::std::__cxx11::string::_M_dispose();
                      if (bVar5) {
                        ::std::operator+(&local_4bf8,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&abs_mat_path,"/Image_Texture_");
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&shaderNodePrim,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&local_4bf8,"opacityThreshold");
                        ::std::__cxx11::string::string
                                  ((string *)&local_4b88,"outputs:r",&local_4c01);
                        Path::Path(&matPrim._abs_path,(string *)&shaderNodePrim,&local_4b88);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                        TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
                                  (&local_1f08,&matPrim._abs_path);
                        local_1f08._empty = true;
                        Path::~Path(&matPrim._abs_path);
                        goto LAB_0027afca;
                      }
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
                      poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
                      poVar7 = ::std::operator<<(poVar7,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                                );
                      poVar7 = ::std::operator<<(poVar7,":");
                      poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
                      poVar7 = ::std::operator<<(poVar7,"():");
                      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x464);
                      ::std::operator<<(poVar7," ");
                      pcVar9 = "Failed to convert \'opacityThreshold\' texture.";
                    }
                  }
                }
                else {
                  pUVar2 = (scene->textures).
                           super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if ((ulong)(((long)(scene->textures).
                                     super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) /
                             0x158) < uVar8) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
                    poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
                    poVar7 = ::std::operator<<(poVar7,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                              );
                    poVar7 = ::std::operator<<(poVar7,":");
                    poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
                    poVar7 = ::std::operator<<(poVar7,"():");
                    poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x44f);
                    ::std::operator<<(poVar7," ");
                    pcVar9 = "Invalid texture_id for \'opacity\' texture.";
                  }
                  else {
                    ::std::__cxx11::string::string
                              ((string *)&matPrim,"opacity",(allocator *)&shaderNodePrim);
                    bVar5 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                                      (&ConstructUVTexture,pUVar2 + uVar8,(string *)&matPrim,
                                       &abs_mat_path,&shader_nodes);
                    ::std::__cxx11::string::_M_dispose();
                    if (bVar5) {
                      ::std::operator+(&local_4bf8,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&abs_mat_path,"/Image_Texture_");
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&shaderNodePrim,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&local_4bf8,"opacity");
                      ::std::__cxx11::string::string((string *)&local_4b88,"outputs:r",&local_4c01);
                      Path::Path(&matPrim._abs_path,(string *)&shaderNodePrim,&local_4b88);
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
                                (&local_2190,&matPrim._abs_path);
                      local_2190._empty = true;
                      Path::~Path(&matPrim._abs_path);
                      goto LAB_0027ad55;
                    }
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
                    poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
                    poVar7 = ::std::operator<<(poVar7,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                              );
                    poVar7 = ::std::operator<<(poVar7,":");
                    poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
                    poVar7 = ::std::operator<<(poVar7,"():");
                    poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x453);
                    ::std::operator<<(poVar7," ");
                    pcVar9 = "Failed to convert \'opacity\' texture.";
                  }
                }
              }
              else {
                pUVar2 = (scene->textures).
                         super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if ((ulong)(((long)(scene->textures).
                                   super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) /
                           0x158) < uVar8) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
                  poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
                  poVar7 = ::std::operator<<(poVar7,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                            );
                  poVar7 = ::std::operator<<(poVar7,":");
                  poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
                  poVar7 = ::std::operator<<(poVar7,"():");
                  poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x43e);
                  ::std::operator<<(poVar7," ");
                  pcVar9 = "Invalid texture_id for \'clearcoatRoughness\' texture.";
                }
                else {
                  ::std::__cxx11::string::string
                            ((string *)&matPrim,"clearcoatRoughness",(allocator *)&shaderNodePrim);
                  bVar5 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                                    (&ConstructUVTexture,pUVar2 + uVar8,(string *)&matPrim,
                                     &abs_mat_path,&shader_nodes);
                  ::std::__cxx11::string::_M_dispose();
                  if (bVar5) {
                    ::std::operator+(&local_4bf8,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&abs_mat_path,"/Image_Texture_");
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&shaderNodePrim,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&local_4bf8,"clearcoatRoughness");
                    ::std::__cxx11::string::string((string *)&local_4b88,"outputs:r",&local_4c01);
                    Path::Path(&matPrim._abs_path,(string *)&shaderNodePrim,&local_4b88);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
                              (&local_26a0,&matPrim._abs_path);
                    local_26a0._empty = true;
                    Path::~Path(&matPrim._abs_path);
                    goto LAB_0027aae0;
                  }
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
                  poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
                  poVar7 = ::std::operator<<(poVar7,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                            );
                  poVar7 = ::std::operator<<(poVar7,":");
                  poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
                  poVar7 = ::std::operator<<(poVar7,"():");
                  poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x442);
                  ::std::operator<<(poVar7," ");
                  pcVar9 = "Failed to convert \'clearcoatRoughness\' texture.";
                }
              }
            }
            else {
              pUVar2 = (scene->textures).
                       super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)(((long)(scene->textures).
                                 super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) / 0x158)
                  < uVar8) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
                poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
                poVar7 = ::std::operator<<(poVar7,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                          );
                poVar7 = ::std::operator<<(poVar7,":");
                poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
                poVar7 = ::std::operator<<(poVar7,"():");
                poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x42d);
                ::std::operator<<(poVar7," ");
                pcVar9 = "Invalid texture_id for \'clearcoat\' texture.";
              }
              else {
                ::std::__cxx11::string::string
                          ((string *)&matPrim,"clearcoat",(allocator *)&shaderNodePrim);
                bVar5 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                                  (&ConstructUVTexture,pUVar2 + uVar8,(string *)&matPrim,
                                   &abs_mat_path,&shader_nodes);
                ::std::__cxx11::string::_M_dispose();
                if (bVar5) {
                  ::std::operator+(&local_4bf8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&abs_mat_path,"/Image_Texture_");
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&shaderNodePrim,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_4bf8,"clearcoat");
                  ::std::__cxx11::string::string((string *)&local_4b88,"outputs:r",&local_4c01);
                  Path::Path(&matPrim._abs_path,(string *)&shaderNodePrim,&local_4b88);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
                            (&local_2928,&matPrim._abs_path);
                  local_2928._empty = true;
                  Path::~Path(&matPrim._abs_path);
                  goto LAB_0027a86b;
                }
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
                poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
                poVar7 = ::std::operator<<(poVar7,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                          );
                poVar7 = ::std::operator<<(poVar7,":");
                poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
                poVar7 = ::std::operator<<(poVar7,"():");
                poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x431);
                ::std::operator<<(poVar7," ");
                pcVar9 = "Failed to convert \'clearcoat\' texture.";
              }
            }
          }
          else {
            pUVar2 = (scene->textures).
                     super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)(((long)(scene->textures).
                               super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) / 0x158) <
                uVar8) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
              poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
              poVar7 = ::std::operator<<(poVar7,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                        );
              poVar7 = ::std::operator<<(poVar7,":");
              poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
              poVar7 = ::std::operator<<(poVar7,"():");
              poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x41c);
              ::std::operator<<(poVar7," ");
              pcVar9 = "Invalid texture_id for \'roughness\' texture.";
            }
            else {
              ::std::__cxx11::string::string
                        ((string *)&matPrim,"roughness",(allocator *)&shaderNodePrim);
              bVar5 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                                (&ConstructUVTexture,pUVar2 + uVar8,(string *)&matPrim,&abs_mat_path
                                 ,&shader_nodes);
              ::std::__cxx11::string::_M_dispose();
              if (bVar5) {
                ::std::operator+(&local_4bf8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&abs_mat_path,"/Image_Texture_");
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&shaderNodePrim,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_4bf8,"roughness");
                ::std::__cxx11::string::string((string *)&local_4b88,"outputs:r",&local_4c01);
                Path::Path(&matPrim._abs_path,(string *)&shaderNodePrim,&local_4b88);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
                          (&local_2418,&matPrim._abs_path);
                local_2418._empty = true;
                Path::~Path(&matPrim._abs_path);
                goto LAB_0027a5f6;
              }
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
              poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
              poVar7 = ::std::operator<<(poVar7,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                        );
              poVar7 = ::std::operator<<(poVar7,":");
              poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
              poVar7 = ::std::operator<<(poVar7,"():");
              poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x420);
              ::std::operator<<(poVar7," ");
              pcVar9 = "Failed to convert \'roughness\' texture.";
            }
          }
        }
        else {
          pUVar2 = (scene->textures).
                   super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)(((long)(scene->textures).
                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) / 0x158) <
              uVar8) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
            poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x40b);
            ::std::operator<<(poVar7," ");
            pcVar9 = "Invalid texture_id for \'metallic\' texture.";
          }
          else {
            ::std::__cxx11::string::string
                      ((string *)&matPrim,"metallic",(allocator *)&shaderNodePrim);
            bVar5 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                              (&ConstructUVTexture,pUVar2 + uVar8,(string *)&matPrim,&abs_mat_path,
                               &shader_nodes);
            ::std::__cxx11::string::_M_dispose();
            if (bVar5) {
              ::std::operator+(&local_4bf8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &abs_mat_path,"/Image_Texture_");
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &shaderNodePrim,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_4bf8,"metallic");
              ::std::__cxx11::string::string((string *)&local_4b88,"outputs:r",&local_4c01);
              Path::Path(&matPrim._abs_path,(string *)&shaderNodePrim,&local_4b88);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
                        (&local_2bb0,&matPrim._abs_path);
              local_2bb0._empty = true;
              Path::~Path(&matPrim._abs_path);
              goto LAB_0027a381;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
            poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x40f);
            ::std::operator<<(poVar7," ");
            pcVar9 = "Failed to convert \'metallic\' texture.";
          }
        }
      }
      else {
        pUVar2 = (scene->textures).
                 super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)(scene->textures).
                           super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) / 0x158) <
            uVar8) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
          poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x3f6);
          ::std::operator<<(poVar7," ");
          pcVar9 = "Invalid texture_id for \'emissiveColor\' texture.";
        }
        else {
          ::std::__cxx11::string::string
                    ((string *)&matPrim,"emissiveColor",(allocator *)&shaderNodePrim);
          bVar5 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                            (&ConstructUVTexture,pUVar2 + uVar8,(string *)&matPrim,&abs_mat_path,
                             &shader_nodes);
          ::std::__cxx11::string::_M_dispose();
          if (bVar5) {
            ::std::operator+(&local_4bf8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &abs_mat_path,"/Image_Texture_");
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &shaderNodePrim,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_4bf8,"emissiveColor");
            ::std::__cxx11::string::string((string *)&local_4b88,"outputs:rgb",&local_4c01);
            Path::Path(&matPrim._abs_path,(string *)&shaderNodePrim,&local_4b88);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::
            set_connection(&local_3368,&matPrim._abs_path);
            local_3368._empty = true;
            Path::~Path(&matPrim._abs_path);
            goto LAB_0027a10c;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
          poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x3fa);
          ::std::operator<<(poVar7," ");
          pcVar9 = "Failed to convert \'emissiveColor\' texture.";
        }
      }
    }
    else {
      pUVar2 = (scene->textures).
               super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(scene->textures).
                         super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) / 0x158) < uVar8
         ) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
        poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x3e1);
        ::std::operator<<(poVar7," ");
        pcVar9 = "Invalid texture_id for \'specularColor\' texture.";
      }
      else {
        ::std::__cxx11::string::string
                  ((string *)&matPrim,"specularColor",(allocator *)&shaderNodePrim);
        bVar5 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                          (&ConstructUVTexture,pUVar2 + uVar8,(string *)&matPrim,&abs_mat_path,
                           &shader_nodes);
        ::std::__cxx11::string::_M_dispose();
        if (bVar5) {
          ::std::operator+(&local_4bf8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &abs_mat_path,"/Image_Texture_");
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &shaderNodePrim,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_4bf8,"specularColor");
          ::std::__cxx11::string::string((string *)&local_4b88,"outputs:rgb",&local_4c01);
          Path::Path(&matPrim._abs_path,(string *)&shaderNodePrim,&local_4b88);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::
          set_connection(&local_2e48,&matPrim._abs_path);
          local_2e48._empty = true;
          Path::~Path(&matPrim._abs_path);
          goto LAB_00279e8d;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
        poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x3e5);
        ::std::operator<<(poVar7," ");
        pcVar9 = "Failed to convert \'specularColor\' texture.";
      }
    }
  }
  else {
    pUVar2 = (scene->textures).
             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(scene->textures).
                       super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) / 0x158) < uVar8)
    {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
      poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x3cb);
      ::std::operator<<(poVar7," ");
      pcVar9 = "Invalid texture_id for \'diffuseColor\' texture.";
    }
    else {
      ::std::__cxx11::string::string((string *)&matPrim,"diffuseColor",(allocator *)&shaderNodePrim)
      ;
      bVar5 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                        (&ConstructUVTexture,pUVar2 + uVar8,(string *)&matPrim,&abs_mat_path,
                         &shader_nodes);
      ::std::__cxx11::string::_M_dispose();
      if (bVar5) {
        ::std::operator+(&local_4bf8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &abs_mat_path,"/Image_Texture_");
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &shaderNodePrim,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_4bf8,"diffuseColor");
        ::std::__cxx11::string::string((string *)&local_4b88,"outputs:rgb",&local_4c01);
        Path::Path(&matPrim._abs_path,(string *)&shaderNodePrim,&local_4b88);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::set_connection
                  (&local_3600,&matPrim._abs_path);
        local_3600._empty = true;
        Path::~Path(&matPrim._abs_path);
        goto LAB_00279c8b;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&matPrim);
      poVar7 = ::std::operator<<((ostream *)&matPrim,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ToMaterialPrim");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x3cf);
      ::std::operator<<(poVar7," ");
      pcVar9 = "Failed to convert \'diffuseColor\' texture.";
    }
  }
  poVar7 = ::std::operator<<((ostream *)&matPrim,pcVar9);
  ::std::operator<<(poVar7,"\n");
  if (err_local != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &shaderNodePrim,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_4bf8,"\n");
    ::std::__cxx11::string::append((string *)err_local);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&matPrim);
  UsdPreviewSurface::~UsdPreviewSurface((UsdPreviewSurface *)&shaderPrim);
  bVar5 = false;
LAB_0027bc72:
  ::std::vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>::~vector(&shader_nodes);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  Shader::~Shader(&shader);
  Material::~Material(&mat);
  return bVar5;
}

Assistant:

static bool ToMaterialPrim(const RenderScene &scene, const std::string &abs_path, size_t material_id, Prim *dst, std::string *err) {

  const RenderMaterial &rmat = scene.materials[material_id];

  // TODO: create two UsdUVTextures for RGBA imagge(rgb and alpha)
  auto ConstructUVTexture = [&](const UVTexture &tex, const std::string &param_name, const std::string &abs_mat_path, /* inout */std::vector<Shader> &shader_nodes) -> bool {


    std::string preaderPrimPath = abs_mat_path + "/uvmap_" + param_name + ".outputs:result";
    Path preaderPath(preaderPrimPath, "");

    if ((tex.texture_image_id < 0) || (size_t(tex.texture_image_id) >= scene.images.size())) {
      PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture_image_id for `{}`", param_name));
    }

    const TextureImage &src_teximg = scene.images[size_t(tex.texture_image_id)];

    UsdUVTexture image_tex;
    image_tex.name = "Image_Texture_" + param_name;

    DCOUT("asset_identifier: " << src_teximg.asset_identifier);
    if (src_teximg.asset_identifier.empty()) {
      PUSH_ERROR_AND_RETURN(fmt::format("file asset name is empty for texture image `{}`", param_name));
    }
    value::AssetPath fileAssetPath(src_teximg.asset_identifier);
    image_tex.file = fileAssetPath;

    // TODO: Set colorSpace in attribute meta.
    Animatable<UsdUVTexture::SourceColorSpace> sourceColorSpace;
    if (src_teximg.colorSpace == ColorSpace::sRGB) {
      sourceColorSpace.set_default(UsdUVTexture::SourceColorSpace::SRGB);
    } else if (src_teximg.colorSpace == ColorSpace::Raw) {
      sourceColorSpace.set_default(UsdUVTexture::SourceColorSpace::Raw);
    } else {
      sourceColorSpace.set_default(UsdUVTexture::SourceColorSpace::Auto);
    }
    image_tex.sourceColorSpace.set_value(sourceColorSpace);
    
    image_tex.st.set_connection(preaderPath);
    image_tex.st.set_value_empty(); // connection only

    Animatable<UsdUVTexture::Wrap> wrapS;
    if (tex.wrapS == UVTexture::WrapMode::CLAMP_TO_EDGE) {
      wrapS.set_default(UsdUVTexture::Wrap::Clamp);
    } else if (tex.wrapS == UVTexture::WrapMode::REPEAT) {
      wrapS.set_default(UsdUVTexture::Wrap::Repeat);
    } else if (tex.wrapS == UVTexture::WrapMode::MIRROR) {
      wrapS.set_default(UsdUVTexture::Wrap::Mirror);
    } else if (tex.wrapS == UVTexture::WrapMode::CLAMP_TO_BORDER) {
      wrapS.set_default(UsdUVTexture::Wrap::Black);
    } else {
      wrapS.set_default(UsdUVTexture::Wrap::Repeat);
    }
    image_tex.wrapS.set_value(wrapS);

    Animatable<UsdUVTexture::Wrap> wrapT;
    if (tex.wrapT == UVTexture::WrapMode::CLAMP_TO_EDGE) {
      wrapT.set_default(UsdUVTexture::Wrap::Clamp);
    } else if (tex.wrapT == UVTexture::WrapMode::REPEAT) {
      wrapT.set_default(UsdUVTexture::Wrap::Repeat);
    } else if (tex.wrapT == UVTexture::WrapMode::MIRROR) {
      wrapT.set_default(UsdUVTexture::Wrap::Mirror);
    } else if (tex.wrapT == UVTexture::WrapMode::CLAMP_TO_BORDER) {
      wrapT.set_default(UsdUVTexture::Wrap::Black);
    } else {
      wrapT.set_default(UsdUVTexture::Wrap::Repeat);
    }
    image_tex.wrapT.set_value(wrapS);

    for (const auto &c : tex.authoredOutputChannels) {
      if (c == UVTexture::Channel::R) {
        image_tex.outputsR.set_authored(true);
      } else if (c == UVTexture::Channel::G) {
        image_tex.outputsG.set_authored(true);
      } else if (c == UVTexture::Channel::B) {
        image_tex.outputsB.set_authored(true);
      } else if (c == UVTexture::Channel::RGB) {
        image_tex.outputsRGB.set_authored(true);
      } else if (c == UVTexture::Channel::RGBA) {
        PUSH_ERROR_AND_RETURN("rgba texture is not supported yet.");
      } 
    }

    UsdTransform2d uv_xform;
    uv_xform.name = "place2d_" + param_name;
    if (tex.has_transform2d) {
      // TODO: Deompose tex.transform and use it?
      uv_xform.translation = tex.tx_translation;
      uv_xform.rotation = tex.tx_rotation;
      uv_xform.scale = tex.tx_scale;

      Shader uv_xformShader;
      uv_xformShader.name = "place2d_" + param_name;
      uv_xformShader.info_id = tinyusdz::kUsdTransform2d;
      uv_xformShader.value = uv_xform;
      shader_nodes.emplace_back(std::move(uv_xformShader));
    }

    UsdPrimvarReader_float2 preader;
    preader.name = "primvar_reader_" + param_name;

    value::float2 fallback_value;
    fallback_value[0] = tex.fallback_uv[0];
    fallback_value[1] = tex.fallback_uv[1];
    if (!math::is_close(fallback_value, {0.0f, 0.0f})) {
      preader.fallback = fallback_value;
    }

    Animatable<std::string> varname;
    // TODO: Ensure primvar with 'varname_uv' exists in bound RenderMesh.
    DCOUT("varname = " << tex.varname_uv);
    varname.set_default(tex.varname_uv);
    preader.varname.set_value(varname);
    preader.result.set_authored(true);


    Shader preaderShader;
    preaderShader.name = "uvmap_" + param_name;
    preaderShader.info_id = tinyusdz::kUsdPrimvarReader_float2;
    preaderShader.value = preader;

    shader_nodes.emplace_back(std::move(preaderShader));

    Shader imageTexShader;
    imageTexShader.name = "Image_Texture_" + param_name;
    imageTexShader.info_id = tinyusdz::kUsdUVTexture;
    imageTexShader.value = image_tex;

    shader_nodes.emplace_back(std::move(imageTexShader));
    
    return true;
  };


  // Layout
  //
  // - Material
  //   - Shader(UsdPreviewSurface)
  //     - UsdUVTexture(Shader)
  //     - TexTransform2d(Shader)
  //     - PrimvarReader
  //

  Material mat;

  mat.name = rmat.name;

  Shader shader;  // root Shader 
  shader.name = "defaultPBR";

  std::string abs_mat_path = abs_path + "/" + mat.name;
  std::string abs_shader_path = abs_mat_path + "/" + shader.name;

  std::vector<Shader> shader_nodes;
  
  {
    UsdPreviewSurface surfaceShader;  // Concrete Shader node object

    //
    // Asssign actual shader object to Shader::value.
    // Also do not forget set its shader node type name through Shader::info_id
    //
    shader.info_id = tinyusdz::kUsdPreviewSurface;  // "UsdPreviewSurface" token

    //
    // Currently no shader network/connection API.
    // Manually construct it.
    //
    surfaceShader.outputsSurface.set_authored(
        true);  // Author `token outputs:surface`

    surfaceShader.useSpecularWorkflow = rmat.surfaceShader.useSpecularWorkflow ? 1 : 0;

    if (rmat.surfaceShader.diffuseColor.is_texture()) {

      if (size_t(rmat.surfaceShader.diffuseColor.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'diffuseColor' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.diffuseColor.texture_id)], "diffuseColor", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'diffuseColor' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "diffuseColor", "outputs:rgb");
      surfaceShader.diffuseColor.set_connection(connPath);
      surfaceShader.diffuseColor.set_value_empty();
    } else {
      value::color3f diffuseCol;
      diffuseCol.r = rmat.surfaceShader.diffuseColor.value[0];
      diffuseCol.g = rmat.surfaceShader.diffuseColor.value[1];
      diffuseCol.b = rmat.surfaceShader.diffuseColor.value[2];

      surfaceShader.diffuseColor.set_value(diffuseCol);
    }

    if (rmat.surfaceShader.specularColor.is_texture()) {

      if (size_t(rmat.surfaceShader.specularColor.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'specularColor' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.specularColor.texture_id)], "specularColor", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'specularColor' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "specularColor", "outputs:rgb");
      surfaceShader.specularColor.set_connection(connPath);
      surfaceShader.specularColor.set_value_empty();
    } else {
      value::color3f col;
      col.r = rmat.surfaceShader.specularColor.value[0];
      col.g = rmat.surfaceShader.specularColor.value[1];
      col.b = rmat.surfaceShader.specularColor.value[2];
      surfaceShader.specularColor = col;
    }

    if (rmat.surfaceShader.emissiveColor.is_texture()) {

      if (size_t(rmat.surfaceShader.emissiveColor.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'emissiveColor' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.emissiveColor.texture_id)], "emissiveColor", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'emissiveColor' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "emissiveColor", "outputs:rgb");
      surfaceShader.emissiveColor.set_connection(connPath);
      surfaceShader.emissiveColor.set_value_empty();
    } else {
      value::color3f col;
      col.r = rmat.surfaceShader.emissiveColor.value[0];
      col.g = rmat.surfaceShader.emissiveColor.value[1];
      col.b = rmat.surfaceShader.emissiveColor.value[2];
      surfaceShader.emissiveColor = col;
    }

    if (rmat.surfaceShader.metallic.is_texture()) {

      if (size_t(rmat.surfaceShader.metallic.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'metallic' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.metallic.texture_id)], "metallic", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'metallic' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "metallic", "outputs:r");
      surfaceShader.metallic.set_connection(connPath);
      surfaceShader.metallic.set_value_empty();
    } else {
      surfaceShader.metallic = rmat.surfaceShader.metallic.value;
    }

    if (rmat.surfaceShader.roughness.is_texture()) {

      if (size_t(rmat.surfaceShader.roughness.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'roughness' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.roughness.texture_id)], "roughness", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'roughness' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "roughness", "outputs:r");
      surfaceShader.roughness.set_connection(connPath);
      surfaceShader.roughness.set_value_empty();
    } else {
      surfaceShader.roughness = rmat.surfaceShader.roughness.value;
    }

    if (rmat.surfaceShader.clearcoat.is_texture()) {

      if (size_t(rmat.surfaceShader.clearcoat.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'clearcoat' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.clearcoat.texture_id)], "clearcoat", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'clearcoat' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "clearcoat", "outputs:r");
      surfaceShader.clearcoat.set_connection(connPath);
      surfaceShader.clearcoat.set_value_empty();
    } else {
      surfaceShader.clearcoat = rmat.surfaceShader.clearcoat.value;
    }

    if (rmat.surfaceShader.clearcoatRoughness.is_texture()) {

      if (size_t(rmat.surfaceShader.clearcoatRoughness.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'clearcoatRoughness' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.clearcoatRoughness.texture_id)], "clearcoatRoughness", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'clearcoatRoughness' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "clearcoatRoughness", "outputs:r");
      surfaceShader.clearcoatRoughness.set_connection(connPath);
      surfaceShader.clearcoatRoughness.set_value_empty();
    } else {
      surfaceShader.clearcoatRoughness = rmat.surfaceShader.clearcoatRoughness.value;
    }

    if (rmat.surfaceShader.opacity.is_texture()) {

      if (size_t(rmat.surfaceShader.opacity.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'opacity' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.opacity.texture_id)], "opacity", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'opacity' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "opacity", "outputs:r");
      surfaceShader.opacity.set_connection(connPath);
      surfaceShader.opacity.set_value_empty();
    } else {
      surfaceShader.opacity = rmat.surfaceShader.opacity.value;
    }

    if (rmat.surfaceShader.opacityThreshold.is_texture()) {

      if (size_t(rmat.surfaceShader.opacityThreshold.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'opacityThreshold' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.opacityThreshold.texture_id)], "opacityThreshold", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'opacityThreshold' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "opacityThreshold", "outputs:r");
      surfaceShader.opacityThreshold.set_connection(connPath);
      surfaceShader.opacityThreshold.set_value_empty();
    } else {
      surfaceShader.opacityThreshold = rmat.surfaceShader.opacityThreshold.value;
    }

    if (rmat.surfaceShader.ior.is_texture()) {

      if (size_t(rmat.surfaceShader.ior.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'ior' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.ior.texture_id)], "ior", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'ior' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "ior", "outputs:r");
      surfaceShader.ior.set_connection(connPath);
      surfaceShader.ior.set_value_empty();
    } else {
      surfaceShader.ior = rmat.surfaceShader.ior.value;
    }

    if (rmat.surfaceShader.occlusion.is_texture()) {

      if (size_t(rmat.surfaceShader.occlusion.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'occlusion' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.occlusion.texture_id)], "occlusion", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'occlusion' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "occlusion", "outputs:r");
      surfaceShader.occlusion.set_connection(connPath);
      surfaceShader.occlusion.set_value_empty();
    } else {
      surfaceShader.occlusion = rmat.surfaceShader.occlusion.value;
    }

    if (rmat.surfaceShader.normal.is_texture()) {

      if (size_t(rmat.surfaceShader.normal.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'normal' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.normal.texture_id)], "normal", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'normal' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "normal", "outputs:rgb");
      surfaceShader.normal.set_connection(connPath);
      surfaceShader.normal.set_value_empty();
    } else {
      value::normal3f n;
      n[0] = rmat.surfaceShader.normal.value[0];
      n[1] = rmat.surfaceShader.normal.value[1];
      n[2] = rmat.surfaceShader.normal.value[2];
      surfaceShader.normal = n;
    }

    if (rmat.surfaceShader.displacement.is_texture()) {

      if (size_t(rmat.surfaceShader.displacement.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'displacement' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.displacement.texture_id)], "displacement", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'displacement' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "displacement", "outputs:rgb");
      surfaceShader.displacement.set_connection(connPath);
      surfaceShader.displacement.set_value_empty();
    
    } else {
      surfaceShader.displacement = rmat.surfaceShader.displacement.value;
    }

    // Connect to UsdPreviewSurface's outputs:surface by setting targetPath.
    //
    // token outputs:surface = </path/to/mat/defaultPBR.outputs:surface>
    mat.surface.set(tinyusdz::Path(/* prim path */ abs_shader_path,
                                   /* prop path */ "outputs:surface"));

    //
    // Shaer::value is `value::Value` type, so can use '=' to assign Shader
    // object.
    //
    shader.value = std::move(surfaceShader);
  }

  Prim shaderPrim(shader);

  Prim matPrim(mat);

  matPrim.add_child(std::move(shaderPrim));

  for (const auto &node : shader_nodes) {
    Prim shaderNodePrim(node);
    
    if (!matPrim.add_child(std::move(shaderNodePrim), /* rename_primname */false, err)) {
      return false;
    } 
  }
  
  (*dst) = std::move(matPrim);
  return true;
}